

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib505.c
# Opt level: O2

int test(char *URL)

{
  undefined8 uVar1;
  int iVar2;
  FILE *__stream;
  int *piVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  char *pcVar7;
  stat file_info;
  
  if (libtest_arg2 == (char *)0x0) {
    curl_mfprintf(_stderr,"Usage: <url> <file-to-upload>\n");
    return 0x76;
  }
  __stream = fopen64(libtest_arg2,"rb");
  if (__stream == (FILE *)0x0) {
    piVar3 = __errno_location();
    uVar1 = _stderr;
    iVar2 = *piVar3;
    pcVar7 = strerror(iVar2);
    curl_mfprintf(uVar1,"fopen failed with error: %d %s\n",iVar2,pcVar7);
    curl_mfprintf(_stderr,"Error opening file: %s\n",libtest_arg2);
    return 0x7e;
  }
  iVar2 = fileno(__stream);
  iVar2 = fstat64(iVar2,(stat64 *)&file_info);
  if (iVar2 == -1) {
    piVar3 = __errno_location();
    uVar1 = _stderr;
    iVar2 = *piVar3;
    pcVar7 = strerror(iVar2);
    curl_mfprintf(uVar1,"fstat() failed with error: %d %s\n",iVar2,pcVar7);
    pcVar7 = "ERROR: cannot open file %s\n";
  }
  else {
    if (file_info.st_size != 0) {
      iVar2 = curl_global_init(3);
      if (iVar2 == 0) {
        lVar4 = curl_easy_init();
        if (lVar4 == 0) {
          curl_mfprintf(_stderr,"curl_easy_init() failed\n");
        }
        else {
          lVar5 = curl_slist_append(0,"RNFR 505");
          if (lVar5 == 0) {
            curl_mfprintf(_stderr,"curl_slist_append() failed\n");
          }
          else {
            lVar6 = curl_slist_append(lVar5,"RNTO 505-forreal");
            if (lVar6 != 0) {
              iVar2 = curl_easy_setopt(lVar4,0x2e,1);
              if ((((iVar2 == 0) && (iVar2 = curl_easy_setopt(lVar4,0x29,1), iVar2 == 0)) &&
                  (iVar2 = curl_easy_setopt(lVar4,0x2712,URL), iVar2 == 0)) &&
                 (((iVar2 = curl_easy_setopt(lVar4,0x2737,lVar5), iVar2 == 0 &&
                   (iVar2 = curl_easy_setopt(lVar4,0x2719,__stream), iVar2 == 0)) &&
                  (iVar2 = curl_easy_setopt(lVar4,0x75a3,file_info.st_size), iVar2 == 0)))) {
                iVar2 = curl_easy_perform(lVar4);
              }
              curl_slist_free_all(lVar5);
              fclose(__stream);
              curl_easy_cleanup(lVar4);
              curl_global_cleanup();
              return iVar2;
            }
            curl_mfprintf(_stderr,"curl_slist_append() failed\n");
            curl_slist_free_all(lVar5);
          }
          curl_easy_cleanup(lVar4);
        }
        curl_global_cleanup();
      }
      else {
        curl_mfprintf(_stderr,"curl_global_init() failed\n");
      }
      goto LAB_0010139a;
    }
    pcVar7 = "ERROR: file %s has zero size!\n";
  }
  curl_mfprintf(_stderr,pcVar7,libtest_arg2);
LAB_0010139a:
  fclose(__stream);
  return 0x7e;
}

Assistant:

int test(char *URL)
{
  CURL *curl;
  CURLcode res = CURLE_OK;
  FILE *hd_src;
  int hd;
  struct_stat file_info;
  struct curl_slist *hl;
  int error;

  struct curl_slist *headerlist=NULL;
  const char *buf_1 = "RNFR 505";
  const char *buf_2 = "RNTO 505-forreal";

  if(!libtest_arg2) {
    fprintf(stderr, "Usage: <url> <file-to-upload>\n");
    return TEST_ERR_USAGE;
  }

  hd_src = fopen(libtest_arg2, "rb");
  if(NULL == hd_src) {
    error = ERRNO;
    fprintf(stderr, "fopen failed with error: %d %s\n",
            error, strerror(error));
    fprintf(stderr, "Error opening file: %s\n", libtest_arg2);
    return TEST_ERR_MAJOR_BAD; /* if this happens things are major weird */
  }

  /* get the file size of the local file */
  hd = fstat(fileno(hd_src), &file_info);
  if(hd == -1) {
    /* can't open file, bail out */
    error = ERRNO;
    fprintf(stderr, "fstat() failed with error: %d %s\n",
            error, strerror(error));
    fprintf(stderr, "ERROR: cannot open file %s\n", libtest_arg2);
    fclose(hd_src);
    return TEST_ERR_MAJOR_BAD;
  }

  if(! file_info.st_size) {
    fprintf(stderr, "ERROR: file %s has zero size!\n", libtest_arg2);
    fclose(hd_src);
    return TEST_ERR_MAJOR_BAD;
  }

  if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    fclose(hd_src);
    return TEST_ERR_MAJOR_BAD;
  }

  /* get a curl handle */
  curl = curl_easy_init();
  if(!curl) {
    fprintf(stderr, "curl_easy_init() failed\n");
    curl_global_cleanup();
    fclose(hd_src);
    return TEST_ERR_MAJOR_BAD;
  }

  /* build a list of commands to pass to libcurl */

  hl = curl_slist_append(headerlist, buf_1);
  if(!hl) {
    fprintf(stderr, "curl_slist_append() failed\n");
    curl_easy_cleanup(curl);
    curl_global_cleanup();
    fclose(hd_src);
    return TEST_ERR_MAJOR_BAD;
  }
  headerlist = curl_slist_append(hl, buf_2);
  if(!headerlist) {
    fprintf(stderr, "curl_slist_append() failed\n");
    curl_slist_free_all(hl);
    curl_easy_cleanup(curl);
    curl_global_cleanup();
    fclose(hd_src);
    return TEST_ERR_MAJOR_BAD;
  }
  headerlist = hl;

  /* enable uploading */
  test_setopt(curl, CURLOPT_UPLOAD, 1L);

  /* enable verbose */
  test_setopt(curl, CURLOPT_VERBOSE, 1L);

  /* specify target */
  test_setopt(curl, CURLOPT_URL, URL);

  /* pass in that last of FTP commands to run after the transfer */
  test_setopt(curl, CURLOPT_POSTQUOTE, headerlist);

  /* now specify which file to upload */
  test_setopt(curl, CURLOPT_READDATA, hd_src);

  /* and give the size of the upload (optional) */
  test_setopt(curl, CURLOPT_INFILESIZE_LARGE,
                   (curl_off_t)file_info.st_size);

  /* Now run off and do what you've been told! */
  res = curl_easy_perform(curl);

test_cleanup:

  /* clean up the FTP commands list */
  curl_slist_free_all(headerlist);

  /* close the local file */
  fclose(hd_src);

  curl_easy_cleanup(curl);
  curl_global_cleanup();

  return res;
}